

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecNum::setTo(DecNum *this,double d,UErrorCode *status)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  decNumber *pdVar4;
  int local_44;
  int32_t local_40;
  int32_t point;
  int32_t length;
  bool sign;
  char buffer [23];
  UErrorCode *status_local;
  double d_local;
  DecNum *this_local;
  
  unique0x10000104 = status;
  uVar3 = std::isnan(d);
  if (((uVar3 & 1) == 0) && (bVar1 = std::isfinite(d), bVar1)) {
    double_conversion::DoubleToStringConverter::DoubleToAscii
              (d,SHORTEST,0,(char *)&length,0x17,(bool *)((long)&point + 3),&local_40,&local_44);
    _setTo(this,(char *)&length,local_40,stack0xffffffffffffffe0);
    pdVar4 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getAlias(&this->fData);
    pdVar4->exponent = (local_44 - local_40) + pdVar4->exponent;
    bVar1 = std::signbit(d);
    bVar2 = 0;
    if (bVar1) {
      bVar2 = 0x80;
    }
    pdVar4 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getAlias(&this->fData);
    pdVar4->bits = pdVar4->bits | bVar2;
    return;
  }
  *stack0xffffffffffffffe0 = U_UNSUPPORTED_ERROR;
  return;
}

Assistant:

void DecNum::setTo(double d, UErrorCode& status) {
    // Need to check for NaN and Infinity before going into DoubleToStringConverter
    if (std::isnan(d) != 0 || std::isfinite(d) == 0) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }

    // First convert from double to string, then string to DecNum.
    // Allocate enough room for: all digits, "E-324", and NUL-terminator.
    char buffer[DoubleToStringConverter::kBase10MaximalLength + 6];
    bool sign; // unused; always positive
    int32_t length;
    int32_t point;
    DoubleToStringConverter::DoubleToAscii(
            d,
            DoubleToStringConverter::DtoaMode::SHORTEST,
            0,
            buffer,
            sizeof(buffer),
            &sign,
            &length,
            &point
    );

    // Read initial result as a string.
    _setTo(buffer, length, status);

    // Set exponent and bitmask. Note that DoubleToStringConverter does not do negatives.
    fData.getAlias()->exponent += point - length;
    fData.getAlias()->bits |= static_cast<uint8_t>(std::signbit(d) ? DECNEG : 0);
}